

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-wrap.cpp
# Opt level: O2

void __thiscall CommandOptions::CommandOptions(CommandOptions *this,int argc,char **argv)

{
  undefined8 uVar1;
  UL *pUVar2;
  int iVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  ChannelFormat_t CVar7;
  undefined8 *puVar8;
  long lVar9;
  ulong uVar10;
  char *__format;
  char *pcVar11;
  int iVar12;
  long lVar13;
  undefined8 uStack_f0;
  allocator<char> local_dd;
  int local_dc;
  string *local_d8;
  string *local_d0;
  PathList_t *local_c8;
  ui32_t length;
  string *local_a0;
  byte_t *local_98;
  byte_t *local_90;
  byte_t *local_88;
  Identifier<16U> *local_80;
  Identifier<16U> *local_78;
  Identifier<16U> *local_70;
  Identifier<16U> *local_68;
  byte_t *local_60;
  bool *local_58;
  string mca_config_str;
  
  this->error_flag = true;
  this->key_flag = false;
  this->asset_id_flag = false;
  this->encrypt_header_flag = true;
  this->write_hmac = true;
  this->verbose_flag = false;
  this->start_frame = 0;
  this->duration = 0xffffffff;
  this->fb_dump_size = 0;
  this->no_write_flag = false;
  this->version_flag = false;
  this->help_flag = false;
  this->stereo_image_flag = false;
  this->write_partial_pcm_flag = false;
  this->use_smpte_labels = false;
  this->j2c_pedantic = true;
  this->fb_size = 0x400000;
  this->key_id_flag = false;
  this->channel_fmt = CF_NONE;
  local_a0 = (string *)&this->out_file;
  (this->out_file)._M_dataplus._M_p = (pointer)&(this->out_file).field_2;
  (this->out_file)._M_string_length = 0;
  (this->out_file).field_2._M_local_buf[0] = '\0';
  this->show_ul_values_flag = false;
  local_c8 = &this->filenames;
  (this->filenames).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)local_c8;
  (this->filenames).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_c8;
  (this->filenames).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->channel_assignment).super_Identifier<16U>.m_HasValue = false;
  (this->channel_assignment).super_Identifier<16U>.m_Value[0] = '\0';
  (this->channel_assignment).super_Identifier<16U>.m_Value[1] = '\0';
  (this->channel_assignment).super_Identifier<16U>.m_Value[2] = '\0';
  (this->channel_assignment).super_Identifier<16U>.m_Value[3] = '\0';
  (this->channel_assignment).super_Identifier<16U>.m_Value[4] = '\0';
  (this->channel_assignment).super_Identifier<16U>.m_Value[5] = '\0';
  (this->channel_assignment).super_Identifier<16U>.m_Value[6] = '\0';
  pUVar2 = &this->channel_assignment;
  (pUVar2->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar2->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar2->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar2->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar2->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar2->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar2->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar2->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->channel_assignment).super_Identifier<16U>.m_Value[0xf] = '\0';
  (this->channel_assignment).super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00114c48;
  (this->picture_coding).super_Identifier<16U>.m_HasValue = false;
  (this->picture_coding).super_Identifier<16U>.m_Value[0] = '\0';
  (this->picture_coding).super_Identifier<16U>.m_Value[1] = '\0';
  (this->picture_coding).super_Identifier<16U>.m_Value[2] = '\0';
  (this->picture_coding).super_Identifier<16U>.m_Value[3] = '\0';
  (this->picture_coding).super_Identifier<16U>.m_Value[4] = '\0';
  (this->picture_coding).super_Identifier<16U>.m_Value[5] = '\0';
  (this->picture_coding).super_Identifier<16U>.m_Value[6] = '\0';
  pUVar2 = &this->picture_coding;
  (pUVar2->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar2->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar2->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar2->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar2->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar2->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar2->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar2->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->picture_coding).super_Identifier<16U>.m_Value[0xf] = '\0';
  (this->picture_coding).super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00114c48;
  (this->transfer_characteristic).super_Identifier<16U>.m_HasValue = false;
  (this->transfer_characteristic).super_Identifier<16U>.m_Value[0] = '\0';
  (this->transfer_characteristic).super_Identifier<16U>.m_Value[1] = '\0';
  (this->transfer_characteristic).super_Identifier<16U>.m_Value[2] = '\0';
  (this->transfer_characteristic).super_Identifier<16U>.m_Value[3] = '\0';
  (this->transfer_characteristic).super_Identifier<16U>.m_Value[4] = '\0';
  (this->transfer_characteristic).super_Identifier<16U>.m_Value[5] = '\0';
  (this->transfer_characteristic).super_Identifier<16U>.m_Value[6] = '\0';
  pUVar2 = &this->transfer_characteristic;
  (pUVar2->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar2->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar2->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar2->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar2->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar2->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar2->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar2->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->transfer_characteristic).super_Identifier<16U>.m_Value[0xf] = '\0';
  (this->transfer_characteristic).super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00114c48;
  (this->aux_data_coding).super_Identifier<16U>.m_HasValue = false;
  (this->aux_data_coding).super_Identifier<16U>.m_Value[0] = '\0';
  (this->aux_data_coding).super_Identifier<16U>.m_Value[1] = '\0';
  (this->aux_data_coding).super_Identifier<16U>.m_Value[2] = '\0';
  (this->aux_data_coding).super_Identifier<16U>.m_Value[3] = '\0';
  (this->aux_data_coding).super_Identifier<16U>.m_Value[4] = '\0';
  (this->aux_data_coding).super_Identifier<16U>.m_Value[5] = '\0';
  (this->aux_data_coding).super_Identifier<16U>.m_Value[6] = '\0';
  pUVar2 = &this->aux_data_coding;
  (pUVar2->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar2->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar2->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar2->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar2->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar2->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar2->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar2->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->aux_data_coding).super_Identifier<16U>.m_Value[0xf] = '\0';
  (this->aux_data_coding).super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00114c48;
  this->dolby_atmos_sync_flag = false;
  this->ffoa = 0;
  this->max_channel_count = 10;
  this->max_object_count = 0x76;
  this->use_interop_sound_wtf = false;
  local_d8 = (string *)&this->mca_config;
  local_dc = argc;
  ASDCP::MXF::ASDCP_MCAConfigParser::ASDCP_MCAConfigParser((ASDCP_MCAConfigParser *)local_d8,g_dict)
  ;
  local_68 = &(this->channel_assignment).super_Identifier<16U>;
  local_70 = &(this->picture_coding).super_Identifier<16U>;
  local_78 = &(this->transfer_characteristic).super_Identifier<16U>;
  local_58 = &(this->transfer_characteristic).super_Identifier<16U>.m_HasValue;
  local_80 = &(this->aux_data_coding).super_Identifier<16U>;
  (this->mca_language)._M_dataplus._M_p = (pointer)&(this->mca_language).field_2;
  (this->mca_language)._M_string_length = 0;
  local_d0 = &this->mca_language;
  (this->mca_language).field_2._M_local_buf[0] = '\0';
  local_88 = this->key_value;
  this->key_value[0] = '\0';
  this->key_value[1] = '\0';
  this->key_value[2] = '\0';
  this->key_value[3] = '\0';
  this->key_value[4] = '\0';
  this->key_value[5] = '\0';
  this->key_value[6] = '\0';
  this->key_value[7] = '\0';
  this->key_value[8] = '\0';
  this->key_value[9] = '\0';
  this->key_value[10] = '\0';
  this->key_value[0xb] = '\0';
  this->key_value[0xc] = '\0';
  this->key_value[0xd] = '\0';
  this->key_value[0xe] = '\0';
  this->key_value[0xf] = '\0';
  local_90 = this->key_id_value;
  this->key_id_value[0] = '\0';
  this->key_id_value[1] = '\0';
  this->key_id_value[2] = '\0';
  this->key_id_value[3] = '\0';
  this->key_id_value[4] = '\0';
  this->key_id_value[5] = '\0';
  this->key_id_value[6] = '\0';
  this->key_id_value[7] = '\0';
  this->key_id_value[8] = '\0';
  this->key_id_value[9] = '\0';
  this->key_id_value[10] = '\0';
  this->key_id_value[0xb] = '\0';
  this->key_id_value[0xc] = '\0';
  this->key_id_value[0xd] = '\0';
  this->key_id_value[0xe] = '\0';
  this->key_id_value[0xf] = '\0';
  mca_config_str._M_dataplus._M_p = (pointer)&mca_config_str.field_2;
  mca_config_str._M_string_length = 0;
  mca_config_str.field_2._M_local_buf[0] = '\0';
  local_60 = (this->transfer_characteristic).super_Identifier<16U>.m_Value;
  local_98 = this->asset_id_value;
  for (iVar12 = 1; iVar12 < local_dc; iVar12 = iVar12 + 1) {
    pcVar11 = argv[iVar12];
    iVar6 = strcmp(pcVar11,"-help");
    iVar3 = local_dc;
    if (iVar6 == 0) {
      this->help_flag = true;
      goto LAB_0010d8a9;
    }
    if (*pcVar11 != '-') {
      std::__cxx11::string::string<std::allocator<char>>((string *)&length,pcVar11,&local_dd);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_c8,(value_type *)&length);
      std::__cxx11::string::~string((string *)&length);
      goto LAB_0010d8a9;
    }
    cVar5 = pcVar11[1];
    iVar6 = isalpha((int)cVar5);
    if ((9 < (int)cVar5 - 0x30U && iVar6 == 0) || (pcVar11[2] != '\0')) {
      __format = "Unrecognized argument: %s\n";
LAB_0010d987:
      fprintf(_stderr,__format,pcVar11);
      goto LAB_0010db20;
    }
    switch(cVar5) {
    case '3':
      this->stereo_image_flag = true;
      break;
    default:
      __format = "Unrecognized option: %s\n";
      goto LAB_0010d987;
    case 'A':
      if (iVar12 + 1 < iVar3) {
        lVar13 = (long)(iVar12 + 1);
        if (*argv[lVar13] != '-') {
          bVar4 = Kumu::Identifier<16U>::DecodeHex(local_80,argv[lVar13]);
LAB_0010d706:
          iVar12 = iVar12 + 1;
          if (bVar4 == false) {
            pcVar11 = argv[lVar13];
            __format = "Error decoding UL value: %s\n";
            goto LAB_0010d987;
          }
          break;
        }
      }
      uStack_f0 = 0x41;
      goto LAB_0010db18;
    case 'C':
      if (iVar12 + 1 < iVar3) {
        lVar13 = (long)(iVar12 + 1);
        if (*argv[lVar13] != '-') {
          bVar4 = Kumu::Identifier<16U>::DecodeHex(local_68,argv[lVar13]);
          goto LAB_0010d706;
        }
      }
      uStack_f0 = 0x43;
      goto LAB_0010db18;
    case 'E':
      this->encrypt_header_flag = false;
      break;
    case 'L':
      this->use_smpte_labels = true;
      break;
    case 'M':
      this->write_hmac = false;
      break;
    case 'P':
      if (iVar12 + 1 < iVar3) {
        lVar13 = (long)(iVar12 + 1);
        if (*argv[lVar13] != '-') {
          bVar4 = Kumu::Identifier<16U>::DecodeHex(local_70,argv[lVar13]);
          goto LAB_0010d706;
        }
      }
      uStack_f0 = 0x50;
      goto LAB_0010db18;
    case 'Q':
      puVar8 = (undefined8 *)ASDCP::Dictionary::Type((MDD_t)g_dict);
      *local_58 = true;
      uVar1 = puVar8[1];
      *(undefined8 *)local_60 = *puVar8;
      *(undefined8 *)(local_60 + 8) = uVar1;
      break;
    case 'T':
      if (iVar12 + 1 < iVar3) {
        lVar13 = (long)(iVar12 + 1);
        if (*argv[lVar13] != '-') {
          bVar4 = Kumu::Identifier<16U>::DecodeHex(local_78,argv[lVar13]);
          goto LAB_0010d706;
        }
      }
      uStack_f0 = 0x54;
LAB_0010db18:
      fprintf(_stderr,"Argument not found for option -%c.\n",uStack_f0);
      goto LAB_0010db20;
    case 'V':
      this->version_flag = true;
      break;
    case 'W':
      this->no_write_flag = true;
      break;
    case 'Z':
      this->j2c_pedantic = false;
      break;
    case 'a':
      this->asset_id_flag = true;
      iVar12 = iVar12 + 1;
      if ((iVar3 <= iVar12) || (*argv[iVar12] == '-')) {
        uStack_f0 = 0x61;
        goto LAB_0010db18;
      }
      Kumu::hex2bin(argv[iVar12],local_98,0x10,&length);
      uVar10 = (ulong)length;
      if (length != 0x10) {
        pcVar11 = "Unexpected asset ID length: %u, expecting %u characters.\n";
LAB_0010db76:
        fprintf(_stderr,pcVar11,uVar10,0x10);
        goto LAB_0010db20;
      }
      break;
    case 'b':
      iVar12 = iVar12 + 1;
      if ((iVar3 <= iVar12) || (*argv[iVar12] == '-')) {
        uStack_f0 = 0x62;
        goto LAB_0010db18;
      }
      lVar9 = strtol(argv[iVar12],(char **)0x0,10);
      lVar13 = -lVar9;
      if (0 < lVar9) {
        lVar13 = lVar9;
      }
      this->fb_size = (ui32_t)lVar13;
      if (this->verbose_flag == true) {
        fprintf(_stderr,"Frame Buffer size: %u bytes.\n");
      }
      break;
    case 'd':
      iVar12 = iVar12 + 1;
      if ((iVar3 <= iVar12) || (*argv[iVar12] == '-')) {
        uStack_f0 = 100;
        goto LAB_0010db18;
      }
      lVar9 = strtol(argv[iVar12],(char **)0x0,10);
      lVar13 = -lVar9;
      if (0 < lVar9) {
        lVar13 = lVar9;
      }
      this->duration = (ui32_t)lVar13;
      break;
    case 'e':
      this->encrypt_header_flag = true;
      break;
    case 'f':
      iVar12 = iVar12 + 1;
      if ((iVar3 <= iVar12) || (*argv[iVar12] == '-')) {
        uStack_f0 = 0x66;
        goto LAB_0010db18;
      }
      lVar9 = strtol(argv[iVar12],(char **)0x0,10);
      lVar13 = -lVar9;
      if (0 < lVar9) {
        lVar13 = lVar9;
      }
      this->start_frame = (ui32_t)lVar13;
      break;
    case 'g':
      iVar12 = iVar12 + 1;
      if ((iVar3 <= iVar12) || (*argv[iVar12] == '-')) {
        uStack_f0 = 0x67;
        goto LAB_0010db18;
      }
      std::__cxx11::string::assign((char *)local_d0);
      break;
    case 'h':
      this->help_flag = true;
      break;
    case 'j':
      this->key_id_flag = true;
      iVar12 = iVar12 + 1;
      if ((iVar3 <= iVar12) || (*argv[iVar12] == '-')) {
        uStack_f0 = 0x6a;
        goto LAB_0010db18;
      }
      Kumu::hex2bin(argv[iVar12],local_90,0x10,&length);
      uVar10 = (ulong)length;
      if (length != 0x10) {
        pcVar11 = "Unexpected key ID length: %u, expecting %u characters.\n";
        goto LAB_0010db76;
      }
      break;
    case 'k':
      this->key_flag = true;
      iVar12 = iVar12 + 1;
      if ((iVar3 <= iVar12) || (*argv[iVar12] == '-')) {
        uStack_f0 = 0x6b;
        goto LAB_0010db18;
      }
      Kumu::hex2bin(argv[iVar12],local_88,0x10,&length);
      uVar10 = (ulong)length;
      if (length != 0x10) {
        pcVar11 = "Unexpected key length: %u, expecting %u characters.\n";
        goto LAB_0010db76;
      }
      break;
    case 'l':
      iVar12 = iVar12 + 1;
      if ((iVar3 <= iVar12) || (*argv[iVar12] == '-')) {
        uStack_f0 = 0x6c;
        goto LAB_0010db18;
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&length,argv[iVar12],&local_dd);
      CVar7 = decode_channel_fmt((string *)&length);
      this->channel_fmt = CVar7;
      std::__cxx11::string::~string((string *)&length);
      break;
    case 'm':
      iVar12 = iVar12 + 1;
      if (iVar3 <= iVar12) {
        uStack_f0 = 0x6d;
        goto LAB_0010db18;
      }
      std::__cxx11::string::assign((char *)&mca_config_str);
      break;
    case 'p':
      iVar12 = iVar12 + 1;
      if ((iVar3 <= iVar12) || (*argv[iVar12] == '-')) {
        uStack_f0 = 0x70;
        goto LAB_0010db18;
      }
      lVar9 = strtol(argv[iVar12],(char **)0x0,10);
      lVar13 = -lVar9;
      if (0 < lVar9) {
        lVar13 = lVar9;
      }
      this->picture_rate = (ui32_t)lVar13;
      break;
    case 's':
      this->dolby_atmos_sync_flag = true;
      break;
    case 'u':
      this->show_ul_values_flag = true;
      break;
    case 'v':
      this->verbose_flag = true;
      break;
    case 'w':
      this->use_interop_sound_wtf = true;
      break;
    case 'x':
      this->write_partial_pcm_flag = true;
      break;
    case 'z':
      this->j2c_pedantic = true;
    }
LAB_0010d8a9:
  }
  if (mca_config_str._M_string_length != 0) {
    if ((this->mca_language)._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&length,"en-US",&local_dd);
      cVar5 = ASDCP::MXF::ASDCP_MCAConfigParser::DecodeString(local_d8,(string *)&mca_config_str);
      std::__cxx11::string::~string((string *)&length);
    }
    else {
      cVar5 = ASDCP::MXF::ASDCP_MCAConfigParser::DecodeString(local_d8,(string *)&mca_config_str);
    }
    if (cVar5 == '\0') goto LAB_0010db20;
  }
  if ((this->help_flag == false) && (this->version_flag == false)) {
    if ((this->filenames).
        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl._M_node._M_size < 2) {
      fputs("Option requires at least two filename arguments: <input-file> <output-file>\n",_stderr)
      ;
    }
    else {
      std::__cxx11::string::_M_assign(local_a0);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back(local_c8);
      this->error_flag = false;
    }
  }
LAB_0010db20:
  std::__cxx11::string::~string((string *)&mca_config_str);
  return;
}

Assistant:

CommandOptions(int argc, const char** argv) :
    error_flag(true), key_flag(false), key_id_flag(false), asset_id_flag(false),
    encrypt_header_flag(true), write_hmac(true),
    verbose_flag(false), fb_dump_size(0),
    no_write_flag(false), version_flag(false), help_flag(false), stereo_image_flag(false),
    write_partial_pcm_flag(false), start_frame(0),
    duration(0xffffffff), use_smpte_labels(false), j2c_pedantic(true),
    fb_size(FRAME_BUFFER_SIZE),
    channel_fmt(PCM::CF_NONE),
    ffoa(0), max_channel_count(10), max_object_count(118), // hard-coded sample atmos properties
    dolby_atmos_sync_flag(false),
    show_ul_values_flag(false),
    mca_config(g_dict),
    use_interop_sound_wtf(false)
  {
    memset(key_value, 0, KeyLen);
    memset(key_id_value, 0, UUIDlen);
    std::string mca_config_str;

    for ( int i = 1; i < argc; i++ )
      {

	if ( (strcmp( argv[i], "-help") == 0) )
	  {
	    help_flag = true;
	    continue;
	  }

	if ( argv[i][0] == '-'
	     && ( isalpha(argv[i][1]) || isdigit(argv[i][1]) )
	     && argv[i][2] == 0 )
	  {
	    switch ( argv[i][1] )
	      {
	      case '3': stereo_image_flag = true; break;

	      case 'A':
		TEST_EXTRA_ARG(i, 'A');
		if ( ! aux_data_coding.DecodeHex(argv[i]) )
		  {
		    fprintf(stderr, "Error decoding UL value: %s\n", argv[i]);
		    return;
		  }
		break;

	      case 'a':
		asset_id_flag = true;
		TEST_EXTRA_ARG(i, 'a');
		{
		  ui32_t length;
		  Kumu::hex2bin(argv[i], asset_id_value, UUIDlen, &length);

		  if ( length != UUIDlen )
		    {
		      fprintf(stderr, "Unexpected asset ID length: %u, expecting %u characters.\n", length, UUIDlen);
		      return;
		    }
		}
		break;

	      case 'b':
		TEST_EXTRA_ARG(i, 'b');
		fb_size = Kumu::xabs(strtol(argv[i], 0, 10));

		if ( verbose_flag )
		  fprintf(stderr, "Frame Buffer size: %u bytes.\n", fb_size);

		break;

	      case 'C':
		TEST_EXTRA_ARG(i, 'C');
		if ( ! channel_assignment.DecodeHex(argv[i]) )
		  {
		    fprintf(stderr, "Error decoding UL value: %s\n", argv[i]);
		    return;
		  }
		break;

	      case 'd':
		TEST_EXTRA_ARG(i, 'd');
		duration = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'E': encrypt_header_flag = false; break;
	      case 'e': encrypt_header_flag = true; break;

	      case 'f':
		TEST_EXTRA_ARG(i, 'f');
		start_frame = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'g':
		TEST_EXTRA_ARG(i, 'g');
		mca_language = argv[i];
		break;

	      case 'h': help_flag = true; break;

	      case 'j': key_id_flag = true;
		TEST_EXTRA_ARG(i, 'j');
		{
		  ui32_t length;
		  Kumu::hex2bin(argv[i], key_id_value, UUIDlen, &length);

		  if ( length != UUIDlen )
		    {
		      fprintf(stderr, "Unexpected key ID length: %u, expecting %u characters.\n", length, UUIDlen);
		      return;
		    }
		}
		break;

	      case 'k': key_flag = true;
		TEST_EXTRA_ARG(i, 'k');
		{
		  ui32_t length;
		  Kumu::hex2bin(argv[i], key_value, KeyLen, &length);

		  if ( length != KeyLen )
		    {
		      fprintf(stderr, "Unexpected key length: %u, expecting %u characters.\n", length, KeyLen);
		      return;
		    }
		}
		break;

	      case 'l':
		TEST_EXTRA_ARG(i, 'l');
		channel_fmt = decode_channel_fmt(argv[i]);
		break;

	      case 'L': use_smpte_labels = true; break;
	      case 'M': write_hmac = false; break;

	      case 'm':
		TEST_EXTRA_ARG_ALLOW_DASH(i, 'm');
		mca_config_str = argv[i];
		break;

	      case 'P':
		TEST_EXTRA_ARG(i, 'P');
		if ( ! picture_coding.DecodeHex(argv[i]) )
		  {
		    fprintf(stderr, "Error decoding UL value: %s\n", argv[i]);
		    return;
		  }
		break;

	      case 'p':
		TEST_EXTRA_ARG(i, 'p');
		picture_rate = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'Q': transfer_characteristic.Set(g_dict->ul(MDD_TransferCharacteristic_SMPTEST2084)); break;

	      case 's': dolby_atmos_sync_flag = true; break;

	      case 'T':
		TEST_EXTRA_ARG(i, 'T');
		if ( ! transfer_characteristic.DecodeHex(argv[i]) )
		  {
		    fprintf(stderr, "Error decoding UL value: %s\n", argv[i]);
		    return;
		  }
		break;

	      case 'u': show_ul_values_flag = true; break;
	      case 'V': version_flag = true; break;
	      case 'v': verbose_flag = true; break;
	      case 'w': use_interop_sound_wtf = true; break;
	      case 'W': no_write_flag = true; break;
	      case 'x': write_partial_pcm_flag = true; break;
	      case 'Z': j2c_pedantic = false; break;
	      case 'z': j2c_pedantic = true; break;

	      default:
		fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
		return;
	      }
	  }
	else
	  {

	    if ( argv[i][0] != '-' )
	      {
		filenames.push_back(argv[i]);
	      }
	    else
	      {
		fprintf(stderr, "Unrecognized argument: %s\n", argv[i]);
		return;
	      }
	  }
      }

    if ( ! mca_config_str.empty() )
      {
	if ( mca_language.empty() )
	  {
	    if ( ! mca_config.DecodeString(mca_config_str) )
	      {
		return;
	      }
	  }
	else
	  {
	    if ( ! mca_config.DecodeString(mca_config_str, mca_language) )
	      {
		return;
	      }
	  }
      }
		
    if ( help_flag || version_flag )
      {
	return;
      }

    if ( filenames.size() < 2 )
      {
	fputs("Option requires at least two filename arguments: <input-file> <output-file>\n", stderr);
	return;
      }

    out_file = filenames.back();
    filenames.pop_back();
    error_flag = false;
  }